

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O0

double __thiscall Calculator::value(Calculator *this,Token *t)

{
  double *pdVar1;
  double local_30;
  double local_20;
  double def;
  Token *t_local;
  Calculator *this_local;
  
  local_20 = 0.0;
  if (t->type == NAME) {
    def = (double)t;
    t_local = (Token *)this;
    pdVar1 = asl::Map<asl::String,_double>::get
                       (&(this->_variables).super_Map<asl::String,_double>,&t->val,&local_20);
    local_30 = *pdVar1;
  }
  else {
    local_30 = t->x;
  }
  return local_30;
}

Assistant:

double Calculator::value(const Calculator::Token& t) const
{
	double def = 0.0;
	return (t.type == NAME)? _variables.get(t.val, def) : t.x;
}